

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

ssize_t Curl_bufq_pass(bufq *q,Curl_bufq_writer *writer,void *writer_ctx,CURLcode *err)

{
  _Bool _Var1;
  size_t amount;
  long lVar2;
  size_t blen;
  uchar *buf;
  size_t local_40;
  uchar *local_38;
  
  _Var1 = Curl_bufq_peek(q,&local_38,&local_40);
  lVar2 = 0;
  while( true ) {
    if (_Var1 == false) {
      return lVar2;
    }
    amount = (*writer)(writer_ctx,local_38,local_40,err);
    if ((long)amount < 0) break;
    if (amount == 0) {
      if (lVar2 == 0) {
        *err = CURLE_AGAIN;
        return -1;
      }
      return lVar2;
    }
    Curl_bufq_skip(q,amount);
    lVar2 = lVar2 + amount;
    _Var1 = Curl_bufq_peek(q,&local_38,&local_40);
  }
  if ((lVar2 != 0) && (*err == CURLE_AGAIN)) {
    return lVar2;
  }
  return -1;
}

Assistant:

ssize_t Curl_bufq_pass(struct bufq *q, Curl_bufq_writer *writer,
                       void *writer_ctx, CURLcode *err)
{
  const unsigned char *buf;
  size_t blen;
  ssize_t nwritten = 0;

  while(Curl_bufq_peek(q, &buf, &blen)) {
    ssize_t chunk_written;

    chunk_written = writer(writer_ctx, buf, blen, err);
    if(chunk_written < 0) {
      if(!nwritten || *err != CURLE_AGAIN) {
        /* blocked on first write or real error, fail */
        nwritten = -1;
      }
      break;
    }
    if(!chunk_written) {
      if(!nwritten) {
        /* treat as blocked */
        *err = CURLE_AGAIN;
        nwritten = -1;
      }
      break;
    }
    Curl_bufq_skip(q, (size_t)chunk_written);
    nwritten += chunk_written;
  }
  return nwritten;
}